

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.h
# Opt level: O3

bool __thiscall
spvtools::opt::BasicBlock::WhileEachInst
          (BasicBlock *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  bool bVar2;
  bool bVar3;
  undefined3 in_register_00000011;
  Instruction *dbg_line_1;
  Instruction *pIVar4;
  Instruction *dbg_line;
  Instruction *pIVar5;
  Instruction *pIVar6;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_40;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000011,run_on_debug_line_insts);
  pIVar6 = (this->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar6 != (Instruction *)0x0) {
    if (run_on_debug_line_insts) {
      pIVar5 = *(Instruction **)
                &(pIVar6->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl;
      pIVar4 = *(pointer *)
                ((long)&(pIVar6->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar5 != pIVar4) {
        do {
          local_40._M_head_impl = pIVar5;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005b736c;
          bVar2 = (*f->_M_invoker)((_Any_data *)f,&local_40._M_head_impl);
          if (!bVar2) {
            return false;
          }
          pIVar5 = pIVar5 + 1;
        } while (pIVar5 != pIVar4);
      }
    }
    local_40._M_head_impl = pIVar6;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_005b736c:
      std::__throw_bad_function_call();
    }
    bVar2 = (*f->_M_invoker)((_Any_data *)f,&local_40._M_head_impl);
    if (!bVar2) {
      return false;
    }
  }
  pIVar6 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar6 == (Instruction *)0x0) ||
     ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_005b7358:
    bVar2 = true;
  }
  else {
    do {
      bVar2 = pIVar6 == (Instruction *)0x0;
      if (bVar2) goto LAB_005b7358;
      pIVar5 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar5 = (Instruction *)0x0;
      }
      if ((char)local_34 != '\0') {
        pIVar1 = (pIVar6->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pIVar4 = (pIVar6->dbg_line_insts_).
                      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                      ._M_impl.super__Vector_impl_data._M_start; pIVar4 != pIVar1;
            pIVar4 = pIVar4 + 1) {
          local_40._M_head_impl = pIVar4;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005b736c;
          bVar3 = (*f->_M_invoker)((_Any_data *)f,&local_40._M_head_impl);
          if (!bVar3) {
            return false;
          }
        }
      }
      local_40._M_head_impl = pIVar6;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005b736c;
      bVar3 = (*f->_M_invoker)((_Any_data *)f,&local_40._M_head_impl);
      pIVar6 = pIVar5;
    } while (bVar3);
  }
  return bVar2;
}

Assistant:

inline bool BasicBlock::WhileEachInst(
    const std::function<bool(Instruction*)>& f, bool run_on_debug_line_insts) {
  if (label_) {
    if (!label_->WhileEachInst(f, run_on_debug_line_insts)) return false;
  }
  if (insts_.empty()) {
    return true;
  }

  Instruction* inst = &insts_.front();
  while (inst != nullptr) {
    Instruction* next_instruction = inst->NextNode();
    if (!inst->WhileEachInst(f, run_on_debug_line_insts)) return false;
    inst = next_instruction;
  }
  return true;
}